

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEObserver.h
# Opt level: O2

vector<double,_std::allocator<double>_> * __thiscall
CEObserver::Time(vector<double,_std::allocator<double>_> *__return_storage_ptr__,CEObserver *this,
                CEDate *date)

{
  double dVar1;
  double __x;
  double dVar2;
  double local_20;
  double local_18;
  
  (*date->_vptr_CEDate[5])(date);
  dVar2 = floor(__x);
  dVar1 = this->utc_offset_;
  local_18 = CppEphem::sec_per_day();
  local_18 = local_18 * (dVar1 / 24.0 + (__x - dVar2));
  local_20 = CETime::TimeSec2Time(&local_18);
  CETime::TimeDbl2Vect(__return_storage_ptr__,&local_20);
  return __return_storage_ptr__;
}

Assistant:

inline
std::vector<double> CEObserver::Time(const CEDate& date)
{
    double utc = date.MJD();
    utc -= std::floor(utc);
    utc += utc_offset_/24.0;            // Do this here for precision reasons
    utc *= CppEphem::sec_per_day();
    return CETime::TimeDbl2Vect( CETime::TimeSec2Time(utc) ) ;
}